

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O2

void __thiscall
P2Pt::pose_poly<float>::find_bounded_root_intervals
          (pose_poly<float> *this,float (*root_ids_out) [1899])

{
  undefined8 uVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined8 in_XMM2_Qb;
  
  fVar3 = fn_t(this,-1.0);
  lVar2 = 0;
  while (lVar2 != 0x76b) {
    auVar5._0_8_ = (double)(int)(lVar2 + 1);
    auVar5._8_8_ = in_XMM2_Qb;
    auVar5 = vfmadd132sd_fma(auVar5,ZEXT816(0xbff0000000000000),ZEXT816(0x3f513f0e8d344724));
    fVar4 = fn_t(this,(float)auVar5._0_8_);
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar4 * fVar3)),ZEXT416(0),1);
    (*root_ids_out)[lVar2] = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
    lVar2 = lVar2 + 1;
    fVar3 = fVar4;
  }
  return;
}

Assistant:

inline void find_bounded_root_intervals(T (*root_ids_out)[ROOT_IDS_LEN]) {
    T curr_val = fn_t(t_vec(0)), next_val;
    for (unsigned i = 0; i < ROOT_IDS_LEN; i++) {
      next_val = fn_t(t_vec(i+1));
      (*root_ids_out)[i] = (curr_val * next_val) < 0;
      curr_val = next_val;
    }
  }